

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O2

void __thiscall DRotatePoly::Tick(DRotatePoly *this)

{
  bool bVar1;
  FPolyObj *this_00;
  double dVar2;
  DAngle local_18;
  
  this_00 = PO_GetPolyobj((this->super_DPolyAction).m_PolyObj);
  if (this_00 != (FPolyObj *)0x0) {
    local_18.Degrees = (this->super_DPolyAction).m_Speed;
    dVar2 = (this->super_DPolyAction).m_Dist;
    if (((dVar2 != -1.0) || (NAN(dVar2))) && (dVar2 < ABS(local_18.Degrees))) {
      local_18.Degrees =
           (double)(~-(ulong)(local_18.Degrees < 0.0) & (ulong)dVar2 |
                   (ulong)-dVar2 & -(ulong)(local_18.Degrees < 0.0));
      (this->super_DPolyAction).m_Speed = local_18.Degrees;
    }
    bVar1 = FPolyObj::RotatePolyobj(this_00,&local_18,false);
    if (bVar1) {
      dVar2 = (this->super_DPolyAction).m_Dist;
      if ((dVar2 != -1.0) || (NAN(dVar2))) {
        dVar2 = dVar2 - ABS((this->super_DPolyAction).m_Speed);
        (this->super_DPolyAction).m_Dist = dVar2;
        if ((dVar2 == 0.0) && (!NAN(dVar2))) {
          SN_StopSequence(this_00);
          (*(this->super_DPolyAction).super_DThinker.super_DObject._vptr_DObject[4])(this);
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void DRotatePoly::Tick ()
{
	FPolyObj *poly = PO_GetPolyobj (m_PolyObj);
	if (poly == NULL) return;

	// Don't let non-perpetual polyobjs overshoot their targets.
	if (m_Dist != -1 && m_Dist < fabs(m_Speed))
	{
		m_Speed = m_Speed < 0 ? -m_Dist : m_Dist;
	}

	if (poly->RotatePolyobj (m_Speed))
	{
		if (m_Dist == -1)
		{ // perpetual polyobj
			return;
		}
		m_Dist -= fabs(m_Speed);
		if (m_Dist == 0)
		{
			SN_StopSequence (poly);
			Destroy ();
		}
	}
}